

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_array.hpp
# Opt level: O3

void __thiscall
test::CustomArray<std::vector<int,_std::allocator<int>_>,_10UL>::CustomArray
          (CustomArray<std::vector<int,_std::allocator<int>_>,_10UL> *this,
          initializer_list<std::vector<int,_std::allocator<int>_>_> il)

{
  runtime_error *this_00;
  vector<int,_std::allocator<int>_> *__x;
  ulong uVar1;
  
  __x = il._M_array;
  memset(this,0,0xf0);
  if (il._M_len == 10) {
    uVar1 = 0xb;
    do {
      std::vector<int,_std::allocator<int>_>::operator=(this->array,__x);
      __x = __x + 1;
      this = (CustomArray<std::vector<int,_std::allocator<int>_>,_10UL> *)((long)this + 0x18);
      uVar1 = uVar1 - 1;
    } while (1 < uVar1);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"init list size does not match array size");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CustomArray(std::initializer_list<T> il)
  {
    if (il.size() != N) { throw std::runtime_error("init list size does not match array size"); }
    std::copy(il.begin(), il.end(), std::begin(array));
  }